

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int httpserver_listen(httpserver_option_t option)

{
  short sVar1;
  int iVar2;
  undefined8 in_stack_00000008;
  ushort local_40;
  ev_cb_t *ev_cb;
  int i;
  int events;
  epoll_event ev_list [1];
  nh_server_t *server;
  
  ev_list[0].data.ptr = malloc(0x30);
  if ((undefined8 *)ev_list[0].data.ptr == (undefined8 *)0x0) {
    __assert_fail("server != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                  ,0x36d,"int httpserver_listen(httpserver_option_t)");
  }
  *(code **)ev_list[0].data.ptr = nh_server_events_cb;
  *(undefined8 *)(ev_list[0].data.u64 + 0x10) = in_stack_00000008;
  sVar1 = (short)option.handler;
  if ((short)option.handler == 0) {
    sVar1 = 10;
  }
  *(short *)(ev_list[0].data.u64 + 0x2c) = sVar1;
  if (option.handler._2_2_ < *(ushort *)(ev_list[0].data.u64 + 0x2c)) {
    local_40 = *(ushort *)(ev_list[0].data.u64 + 0x2c);
  }
  else {
    local_40 = option.handler._2_2_;
  }
  *(ushort *)(ev_list[0].data.u64 + 0x2e) = local_40;
  iVar2 = epoll_create1(0);
  *(int *)(ev_list[0].data.u64 + 0xc) = iVar2;
  nh_server_listen((nh_server_t *)ev_list[0].data.ptr,(char *)option._8_8_,(int)option.ip_addr);
  while (iVar2 = epoll_wait(*(int *)(ev_list[0].data.u64 + 0xc),(epoll_event *)&i,1,-1), -1 < iVar2)
  {
    for (ev_cb._4_4_ = 0; ev_cb._4_4_ < iVar2; ev_cb._4_4_ = ev_cb._4_4_ + 1) {
      (*(code *)**(undefined8 **)((long)&ev_list[(long)ev_cb._4_4_ + -1].data + 4))
                (&i + (long)ev_cb._4_4_ * 3);
    }
  }
  return 0;
}

Assistant:

int httpserver_listen(httpserver_option_t option) {
    nh_server_t *server = (nh_server_t *) malloc(sizeof(nh_server_t));
    assert(server != NULL);
    server->handler = nh_server_events_cb;
    server->request_handler = option.handler;
    server->timeout = option.timeout > 0 ? option.timeout : DEFAULT_TIMEOUT;
    server->keep_alive_timeout = MAX(server->timeout, option.keep_alive_timeout);
    server->loop = epoll_create1(0);

    nh_server_listen(server, option.ip_addr, option.port);

    struct epoll_event ev_list[1];
    int events;
    while ((events = epoll_wait(server->loop, ev_list, 1, -1)) > -1) {
        for (int i = 0; i < events; i++) {
            ev_cb_t *ev_cb = (ev_cb_t *) ev_list[i].data.ptr;
            ev_cb->handler(&ev_list[i]);
        }
    }
    return 0;
}